

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::RsProdSyntax*>::emplaceRealloc<slang::syntax::RsProdSyntax*>
          (SmallVectorBase<slang::syntax::RsProdSyntax*> *this,pointer pos,RsProdSyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppRVar3;
  RsProdSyntax **__result;
  RsProdSyntax **ppRVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  RsProdSyntax **args_local;
  pointer pos_local;
  SmallVectorBase<slang::syntax::RsProdSyntax_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::max_size
                    ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<slang::syntax::RsProdSyntax_*>::calculateGrowth
                       ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this,
                        *(long *)(this + 8) + 1);
  ppRVar3 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::begin
                      ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this);
  __result = (RsProdSyntax **)slang::detail::allocArray(capacity,8);
  ppRVar4 = __result + ((long)pos - (long)ppRVar3 >> 3);
  *ppRVar4 = *args;
  ppRVar3 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::end
                      ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this);
  if (pos == ppRVar3) {
    ppRVar3 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::RsProdSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this);
    std::uninitialized_move<slang::syntax::RsProdSyntax**,slang::syntax::RsProdSyntax**>
              (ppRVar3,(RsProdSyntax **)ctx,__result);
  }
  else {
    ppRVar3 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this);
    std::uninitialized_move<slang::syntax::RsProdSyntax**,slang::syntax::RsProdSyntax**>
              (ppRVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::RsProdSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this);
    std::uninitialized_move<slang::syntax::RsProdSyntax**,slang::syntax::RsProdSyntax**>
              (pos,(RsProdSyntax **)ctx,ppRVar4 + 1);
  }
  SmallVectorBase<slang::syntax::RsProdSyntax_*>::cleanup
            ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(RsProdSyntax ***)this = __result;
  return ppRVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}